

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

ptr<Expression> __thiscall Parser::expression(Parser *this)

{
  initializer_list<TokenType> __l;
  bool bVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  Parser *in_RSI;
  ptr<Expression> pVar3;
  undefined1 local_160 [48];
  shared_ptr<Exponentiation> local_130;
  shared_ptr<Division> local_120;
  shared_ptr<Subtraction> local_110;
  shared_ptr<Multiplication> local_100;
  shared_ptr<Addition> local_f0;
  undefined1 local_e0 [8];
  ptr<Operation> additionalOperation;
  undefined1 local_90 [4];
  TokenType assignType;
  ptr<Symbol> symbol;
  allocator<TokenType> local_69;
  TokenType local_68 [8];
  iterator local_48;
  size_type local_40;
  vector<TokenType,_std::allocator<TokenType>_> local_38;
  undefined1 local_19;
  Parser *this_local;
  ptr<Expression> *expr;
  
  local_19 = 0;
  this_local = this;
  disjunction(this);
  local_68[4] = 0x15;
  local_68[5] = ExpAssign;
  local_68[6] = ModAssign;
  local_68[0] = Assign;
  local_68[1] = PlusAssign;
  local_68[2] = 0x14;
  local_68[3] = 0x13;
  local_48 = local_68;
  local_40 = 7;
  std::allocator<TokenType>::allocator(&local_69);
  __l._M_len = local_40;
  __l._M_array = local_48;
  std::vector<TokenType,_std::allocator<TokenType>_>::vector(&local_38,__l,&local_69);
  bVar1 = matchAny(in_RSI,&local_38);
  std::vector<TokenType,_std::allocator<TokenType>_>::~vector(&local_38);
  std::allocator<TokenType>::~allocator(&local_69);
  _Var2._M_pi = extraout_RDX;
  if (bVar1) {
    std::dynamic_pointer_cast<Symbol,Expression>((shared_ptr<Expression> *)local_90);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_90);
    if (!bVar1) {
      error(in_RSI,"The left operand of the assignment operator is not an lvalue");
    }
    token((Token *)&additionalOperation.super___shared_ptr<Operation,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,in_RSI);
    Token::~Token((Token *)&additionalOperation.
                            super___shared_ptr<Operation,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    consume(in_RSI);
    std::shared_ptr<Operation>::shared_ptr((shared_ptr<Operation> *)local_e0);
    if ((int)additionalOperation.super___shared_ptr<Operation,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi == 0x12) {
      make<Addition>();
      std::shared_ptr<Operation>::operator=((shared_ptr<Operation> *)local_e0,&local_f0);
      std::shared_ptr<Addition>::~shared_ptr(&local_f0);
    }
    else if ((int)additionalOperation.super___shared_ptr<Operation,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi == 0x14) {
      make<Multiplication>();
      std::shared_ptr<Operation>::operator=((shared_ptr<Operation> *)local_e0,&local_100);
      std::shared_ptr<Multiplication>::~shared_ptr(&local_100);
    }
    else if ((int)additionalOperation.super___shared_ptr<Operation,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi == 0x13) {
      make<Subtraction>();
      std::shared_ptr<Operation>::operator=((shared_ptr<Operation> *)local_e0,&local_110);
      std::shared_ptr<Subtraction>::~shared_ptr(&local_110);
    }
    else if ((int)additionalOperation.super___shared_ptr<Operation,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi == 0x15) {
      make<Division>();
      std::shared_ptr<Operation>::operator=((shared_ptr<Operation> *)local_e0,&local_120);
      std::shared_ptr<Division>::~shared_ptr(&local_120);
    }
    else if ((int)additionalOperation.super___shared_ptr<Operation,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi == 0x17) {
      make<Exponentiation>();
      std::shared_ptr<Operation>::operator=((shared_ptr<Operation> *)local_e0,&local_130);
      std::shared_ptr<Exponentiation>::~shared_ptr(&local_130);
    }
    else if ((int)additionalOperation.super___shared_ptr<Operation,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi == 0x16) {
      make<Modulo>();
      std::shared_ptr<Operation>::operator=
                ((shared_ptr<Operation> *)local_e0,(shared_ptr<Modulo> *)(local_160 + 0x20));
      std::shared_ptr<Modulo>::~shared_ptr((shared_ptr<Modulo> *)(local_160 + 0x20));
    }
    disjunction((Parser *)local_160);
    make<Assignment,std::shared_ptr<Operation>&,std::shared_ptr<Symbol>&,std::shared_ptr<Expression>>
              ((shared_ptr<Operation> *)(local_160 + 0x10),(shared_ptr<Symbol> *)local_e0,
               (shared_ptr<Expression> *)local_90);
    std::shared_ptr<Expression>::operator=
              ((shared_ptr<Expression> *)this,(shared_ptr<Assignment> *)(local_160 + 0x10));
    std::shared_ptr<Assignment>::~shared_ptr((shared_ptr<Assignment> *)(local_160 + 0x10));
    std::shared_ptr<Expression>::~shared_ptr((shared_ptr<Expression> *)local_160);
    std::shared_ptr<Operation>::~shared_ptr((shared_ptr<Operation> *)local_e0);
    std::shared_ptr<Symbol>::~shared_ptr((shared_ptr<Symbol> *)local_90);
    _Var2._M_pi = extraout_RDX_00;
  }
  pVar3.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi;
  pVar3.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Expression>)pVar3.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Expression> Parser::expression() {
    ptr<Expression> expr = disjunction();

    if(matchAny({ TokenType::Assign, TokenType::PlusAssign, TokenType::MultAssign, TokenType::MinusAssign, TokenType::DivAssign, TokenType::ExpAssign, TokenType::ModAssign })) {
        // todo: Do a better symbol check!!!
        ptr<Symbol> symbol = std::dynamic_pointer_cast<Symbol>(expr);
        if(!symbol)
            error("The left operand of the assignment operator is not an lvalue");

        TokenType assignType = token().type;
        consume();
        ptr<Operation> additionalOperation;

        if(assignType == TokenType::PlusAssign)
            additionalOperation = make<Addition>();
        else if(assignType == TokenType::MultAssign)
            additionalOperation = make<Multiplication>();
        else if(assignType == TokenType::MinusAssign)
            additionalOperation = make<Subtraction>();
        else if(assignType == TokenType::DivAssign)
            additionalOperation = make<Division>();
        else if(assignType == TokenType::ExpAssign)
            additionalOperation = make<Exponentiation>();
        else if(assignType == TokenType::ModAssign)
            additionalOperation = make<Modulo>();

        expr = make<Assignment>(additionalOperation, symbol, disjunction());
    }

    return expr;
}